

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O1

float __thiscall ser::MetainfoSet::AsDouble(MetainfoSet *this,string *key)

{
  char *__s1;
  pointer pcVar1;
  int iVar2;
  const_iterator cVar3;
  undefined *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  bool *pbVar6;
  int *piVar7;
  float *pfVar8;
  double *pdVar9;
  ostream *poVar10;
  _Base_ptr operand;
  float v;
  stringstream ss;
  float local_1c4;
  char *local_1c0;
  long local_1b8;
  char local_1b0 [16];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  cVar3 = checkKeyExists(this,key);
  if (*(long **)(cVar3._M_node + 2) == (long *)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    puVar4 = (undefined *)(**(code **)(**(long **)(cVar3._M_node + 2) + 0x10))();
  }
  operand = cVar3._M_node + 2;
  __s1 = *(char **)(puVar4 + 8);
  if ((__s1 == _ofstream) || ((*__s1 != '*' && (iVar2 = strcmp(__s1,_ofstream), iVar2 == 0)))) {
    pbVar6 = boost::any_cast<bool_const&>((any *)operand);
    return (float)(int)*pbVar6;
  }
  if ((__s1 == _put) || ((*__s1 != '*' && (iVar2 = strcmp(__s1,_put), iVar2 == 0)))) {
    piVar7 = boost::any_cast<int_const&>((any *)operand);
    return (float)*piVar7;
  }
  if ((__s1 != _pthread_mutex_init) &&
     ((*__s1 == '*' || (iVar2 = strcmp(__s1,_pthread_mutex_init), iVar2 != 0)))) {
    if ((__s1 == _typeinfo) || ((*__s1 != '*' && (iVar2 = strcmp(__s1,_typeinfo), iVar2 == 0)))) {
      pdVar9 = boost::any_cast<double_const&>((any *)operand);
      local_1c4 = (float)*pdVar9;
    }
    else {
      if ((__s1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
         ((*__s1 == '*' ||
          (iVar2 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar2 != 0))
         )) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"Bug in MetainfoSet: type of \'");
        poVar10 = std::operator<<(poVar10,(string *)key);
        std::operator<<(poVar10,"\' not recognized\n");
        exit(1);
      }
      std::__cxx11::stringstream::stringstream(local_1a0);
      pbVar5 = boost::any_cast<std::__cxx11::string_const&>((any *)operand);
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      local_1c0 = local_1b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,pcVar1,pcVar1 + pbVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(local_190,local_1c0,local_1b8);
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0);
      }
      std::istream::_M_extract<float>((float *)local_1a0);
      std::__cxx11::stringstream::~stringstream(local_1a0);
      std::ios_base::~ios_base(local_120);
    }
    return local_1c4;
  }
  pfVar8 = boost::any_cast<float_const&>((any *)operand);
  return *pfVar8;
}

Assistant:

float MetainfoSet::AsDouble(const std::string& key) const
{
    std::map<std::string, boost::any>::const_iterator iter = checkKeyExists(key);
    const boost::any& a = iter->second;
    const std::type_info& t = a.type();

         if(t == typeid(bool)) return boost::any_cast<bool>(a);
    else if(t == typeid(int)) return boost::any_cast<int>(a);
    else if(t == typeid(float)) return boost::any_cast<float>(a);
    else if(t == typeid(double)) return boost::any_cast<double>(a);
    else if(t == typeid(std::string))
    {
        float v;
        std::stringstream ss;
        ss << boost::any_cast<std::string>(a);
        ss >> v;
        return v;
    }

    // Reaching this point is a bug.
    std::cerr << "Bug in MetainfoSet: type of '" << key << "' not recognized\n";
    std::exit(1);
    return (double)0.;
}